

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O0

void __thiscall Lz77Encoder::run(Lz77Encoder *this)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  string local_2f8;
  Lz77Node *local_2d8;
  Lz77Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Lz77Node,_std::allocator<Lz77Node>_> *__range1;
  stringstream out;
  ostream local_2a8 [376];
  string local_130;
  byte local_109;
  string local_108;
  byte local_e1;
  string local_e0;
  string local_c0;
  uint local_a0;
  int local_9c;
  uint initial_j;
  int temp_shift;
  int temp_amount;
  uint j;
  char local_69;
  uint local_68;
  int iStack_64;
  value_type symbol;
  uint initial_i;
  int shift;
  int amount;
  string local_50;
  uint local_2c;
  undefined1 local_28 [4];
  uint i;
  vector<Lz77Node,_std::allocator<Lz77Node>_> table;
  Lz77Encoder *this_local;
  
  table.super__Vector_base<Lz77Node,_std::allocator<Lz77Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  poVar3 = std::operator<<((ostream *)&std::cout,"LZ77 encryption...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<Lz77Node,_std::allocator<Lz77Node>_>::vector
            ((vector<Lz77Node,_std::allocator<Lz77Node>_> *)local_28);
  local_2c = 0;
  while( true ) {
    uVar4 = (ulong)local_2c;
    Cryptor::get_in_message_abi_cxx11_(&local_50,&this->super_Cryptor);
    uVar5 = std::__cxx11::string::length();
    std::__cxx11::string::~string((string *)&local_50);
    if (uVar5 <= uVar4) break;
    initial_i = 0;
    iStack_64 = 0;
    local_68 = local_2c;
    Cryptor::get_in_message_abi_cxx11_((string *)&temp_amount,&this->super_Cryptor);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&temp_amount);
    cVar1 = *pcVar6;
    std::__cxx11::string::~string((string *)&temp_amount);
    temp_shift = local_2c;
    local_69 = cVar1;
    while( true ) {
      initial_j = 0;
      local_9c = 0;
      local_a0 = temp_shift;
      while( true ) {
        uVar4 = (ulong)local_68;
        local_e1 = 0;
        local_109 = 0;
        Cryptor::get_in_message_abi_cxx11_(&local_c0,&this->super_Cryptor);
        uVar5 = std::__cxx11::string::length();
        bVar7 = false;
        if (uVar4 < uVar5) {
          Cryptor::get_in_message_abi_cxx11_(&local_e0,&this->super_Cryptor);
          local_e1 = 1;
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&local_e0);
          cVar1 = *pcVar6;
          Cryptor::get_in_message_abi_cxx11_(&local_108,&this->super_Cryptor);
          local_109 = 1;
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&local_108);
          bVar7 = false;
          if (cVar1 == *pcVar6) {
            bVar7 = local_a0 < local_2c;
          }
        }
        if ((local_109 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_108);
        }
        if ((local_e1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_e0);
        }
        std::__cxx11::string::~string((string *)&local_c0);
        if (!bVar7) break;
        local_68 = local_68 + 1;
        local_a0 = local_a0 + 1;
        initial_j = initial_j + 1;
        if (local_9c == 0) {
          local_9c = local_2c - temp_shift;
        }
      }
      if (((int)initial_i < (int)initial_j) && (3 < (int)initial_j)) {
        initial_i = initial_j;
        iStack_64 = local_9c;
      }
      else {
        local_68 = local_2c;
      }
      if (temp_shift == 0) break;
      temp_shift = temp_shift + -1;
    }
    local_2c = local_2c + initial_i;
    Cryptor::get_in_message_abi_cxx11_(&local_130,&this->super_Cryptor);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&local_130);
    local_69 = *pcVar6;
    std::__cxx11::string::~string((string *)&local_130);
    std::vector<Lz77Node,std::allocator<Lz77Node>>::emplace_back<char&,int&,int&>
              ((vector<Lz77Node,std::allocator<Lz77Node>> *)local_28,&local_69,
               &stack0xffffffffffffff9c,(int *)&initial_i);
    local_2c = local_2c + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  __end1 = std::vector<Lz77Node,_std::allocator<Lz77Node>_>::begin
                     ((vector<Lz77Node,_std::allocator<Lz77Node>_> *)local_28);
  node = (Lz77Node *)
         std::vector<Lz77Node,_std::allocator<Lz77Node>_>::end
                   ((vector<Lz77Node,_std::allocator<Lz77Node>_> *)local_28);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Lz77Node_*,_std::vector<Lz77Node,_std::allocator<Lz77Node>_>_>
                                     *)&node), bVar7) {
    local_2d8 = __gnu_cxx::
                __normal_iterator<Lz77Node_*,_std::vector<Lz77Node,_std::allocator<Lz77Node>_>_>::
                operator*(&__end1);
    iVar2 = Lz77Node::get_offset(local_2d8);
    if ((iVar2 != 0) && (iVar2 = Lz77Node::get_amount(local_2d8), iVar2 != 0)) {
      poVar3 = std::operator<<(local_2a8,'[');
      iVar2 = Lz77Node::get_offset(local_2d8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3,',');
      iVar2 = Lz77Node::get_amount(local_2d8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3,']');
      std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    }
    cVar1 = Lz77Node::get_symbol(local_2d8);
    poVar3 = std::operator<<(local_2a8,cVar1);
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Lz77Node_*,_std::vector<Lz77Node,_std::allocator<Lz77Node>_>_>::
    operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  Cryptor::set_out_message(&this->super_Cryptor,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  poVar3 = std::operator<<((ostream *)&std::cout,"encryption done!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  std::vector<Lz77Node,_std::allocator<Lz77Node>_>::~vector
            ((vector<Lz77Node,_std::allocator<Lz77Node>_> *)local_28);
  return;
}

Assistant:

void Lz77Encoder::run() {
  cout << "LZ77 encryption..." << endl;

  //iterate through message & write it into table
  vector<Lz77Node> table;
  for (unsigned int i = 0; i < get_in_message().length(); i++) {

    //initial data
    auto amount = 0;
    auto shift = 0;
    auto initial_i = i;
    auto symbol = get_in_message()[i];

    //iterate through encoded sequence
    for (auto j = i; ; j--) {

      auto temp_amount = 0;
      auto temp_shift = 0;
      auto initial_j = j;

      while (initial_i < get_in_message().length() &&
        get_in_message()[initial_i] == get_in_message()[initial_j] &&
        initial_j < i) {

        initial_i++;
        initial_j++;
        temp_amount++;

        if (temp_shift == 0) {
          //relative offset
          temp_shift = i - j;
        }
      }

      //no reason to refer if repetition is less than 4 chars
      if (temp_amount > amount && temp_amount > 3) {
        amount = temp_amount;
        shift = temp_shift;
      }
      else {
        initial_i = i;
      }

      if (j == 0)
      {
        break;
      }
    }

    i += amount;
    symbol = get_in_message()[i];
    table.emplace_back(symbol, shift, amount);
  }

  stringstream out;
  for (auto& node : table) {
    if (node.get_offset() != 0 && node.get_amount() != 0) {
      out << LEFT_BREAK << node.get_offset() << SEPARATOR << node.get_amount() << RIGHT_BREAK << flush;
    }
    out << node.get_symbol() << flush;
  }
  set_out_message(out.str());

  cout << "encryption done!" << endl;
}